

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_circuit_library.cpp
# Opt level: O2

ModelCircuit * __thiscall
lsim::ModelCircuitLibrary::create_circuit(ModelCircuitLibrary *this,char *name,LSimContext *context)

{
  mapped_type pMVar1;
  mapped_type *ppMVar2;
  char *name_local;
  ModelCircuitLibrary *local_48;
  LSimContext *context_local;
  key_type local_38;
  
  name_local = name;
  context_local = context;
  if (name != (char *)0x0) {
    local_48 = this;
    std::make_unique<lsim::ModelCircuit,char_const*&,lsim::LSimContext*&,lsim::ModelCircuitLibrary*>
              ((char **)&local_38,(LSimContext **)&name_local,(ModelCircuitLibrary **)&context_local
              );
    std::
    vector<std::unique_ptr<lsim::ModelCircuit,std::default_delete<lsim::ModelCircuit>>,std::allocator<std::unique_ptr<lsim::ModelCircuit,std::default_delete<lsim::ModelCircuit>>>>
    ::emplace_back<std::unique_ptr<lsim::ModelCircuit,std::default_delete<lsim::ModelCircuit>>>
              ((vector<std::unique_ptr<lsim::ModelCircuit,std::default_delete<lsim::ModelCircuit>>,std::allocator<std::unique_ptr<lsim::ModelCircuit,std::default_delete<lsim::ModelCircuit>>>>
                *)&this->m_circuits,
               (unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_> *)&local_38
              );
    std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>::~unique_ptr
              ((unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_> *)&local_38
              );
    pMVar1 = (this->m_circuits).
             super__Vector_base<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>,_std::allocator<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>.
             _M_t.
             super__Tuple_impl<0UL,_lsim::ModelCircuit_*,_std::default_delete<lsim::ModelCircuit>_>.
             super__Head_base<0UL,_lsim::ModelCircuit_*,_false>._M_head_impl;
    std::__cxx11::string::string((string *)&local_38,name_local,(allocator *)&local_48);
    ppMVar2 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelCircuit_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelCircuit_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelCircuit_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelCircuit_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->m_circuit_lut,&local_38);
    *ppMVar2 = pMVar1;
    std::__cxx11::string::~string((string *)&local_38);
    return pMVar1;
  }
  __assert_fail("name",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/model_circuit_library.cpp"
                ,0x11,
                "ModelCircuit *lsim::ModelCircuitLibrary::create_circuit(const char *, LSimContext *)"
               );
}

Assistant:

ModelCircuit *ModelCircuitLibrary::create_circuit(const char *name, LSimContext *context) {
    assert(name);

    m_circuits.push_back(std::make_unique<ModelCircuit>(name, context, this));
    auto circuit = m_circuits.back().get();
    m_circuit_lut[name] = circuit;

    return circuit;
}